

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::GLSL420Pack::ImplicitConversionsValidTest::prepareNextTestCase
          (ImplicitConversionsValidTest *this,GLuint test_case_index)

{
  int iVar1;
  GLchar *pGVar2;
  size_t sVar3;
  bool bVar4;
  pointer ptVar5;
  undefined1 local_1a0 [8];
  _func_int **local_198;
  ios_base local_128 [264];
  
  this->m_current_test_case_index = test_case_index;
  bVar4 = true;
  if (test_case_index != 0xffffffff) {
    ptVar5 = (this->m_test_cases).
             super__Vector_base<gl4cts::GLSL420Pack::ImplicitConversionsValidTest::testCase,_std::allocator<gl4cts::GLSL420Pack::ImplicitConversionsValidTest::testCase>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)test_case_index <
        (ulong)((long)(this->m_test_cases).
                      super__Vector_base<gl4cts::GLSL420Pack::ImplicitConversionsValidTest::testCase,_std::allocator<gl4cts::GLSL420Pack::ImplicitConversionsValidTest::testCase>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ptVar5 >> 4)) {
      local_1a0 = *(undefined1 (*) [8])(**(long **)&this->field_0x70 + 0x10);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198,"T1:",3);
      ptVar5 = ptVar5 + test_case_index;
      pGVar2 = Utils::getTypeName((ptVar5->m_types).m_t1,ptVar5->m_n_cols,ptVar5->m_n_rows);
      iVar1 = (int)(ostringstream *)&local_198;
      if (pGVar2 == (GLchar *)0x0) {
        std::ios::clear(iVar1 + (int)local_198[-3]);
      }
      else {
        sVar3 = strlen(pGVar2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198,pGVar2,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198," T2:",4);
      pGVar2 = Utils::getTypeName((ptVar5->m_types).m_t2,ptVar5->m_n_cols,ptVar5->m_n_rows);
      if (pGVar2 == (GLchar *)0x0) {
        std::ios::clear(iVar1 + (int)local_198[-3]);
      }
      else {
        sVar3 = strlen(pGVar2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198,pGVar2,sVar3);
      }
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
      std::ios_base::~ios_base(local_128);
    }
    else {
      bVar4 = false;
    }
  }
  return bVar4;
}

Assistant:

bool ImplicitConversionsValidTest::prepareNextTestCase(glw::GLuint test_case_index)
{
	m_current_test_case_index = test_case_index;

	if ((glw::GLuint)-1 == test_case_index)
	{
		return true;
	}
	else if (m_test_cases.size() <= test_case_index)
	{
		return false;
	}

	const testCase& test_case = m_test_cases[test_case_index];

	m_context.getTestContext().getLog() << tcu::TestLog::Message
										<< "T1:" << Utils::getTypeName(test_case.m_types.m_t1, test_case.m_n_cols,
																	   test_case.m_n_rows)
										<< " T2:" << Utils::getTypeName(test_case.m_types.m_t2, test_case.m_n_cols,
																		test_case.m_n_rows)
										<< tcu::TestLog::EndMessage;

	return true;
}